

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O3

void soul::heart::Utilities::inlineFunctionsThatUseAdvanceOrStreams<soul::Optimisations>
               (Program *program)

{
  pointer ppVar1;
  bool bVar2;
  pool_ref<soul::Module> *m;
  pointer ppVar3;
  anon_class_8_1_70e95164 inlineNextOccurrence;
  anon_class_8_1_70e95164 local_20;
  
  ppVar3 = (program->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (program->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar1) {
    local_20.program = program;
    do {
      if (ppVar3->object->moduleType == processorModule) {
        do {
          bVar2 = inlineFunctionsThatUseAdvanceOrStreams<soul::Optimisations>::
                  anon_class_8_1_70e95164::operator()(&local_20,ppVar3->object);
        } while (bVar2);
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  return;
}

Assistant:

static void inlineFunctionsThatUseAdvanceOrStreams (Program& program)
    {
        auto inlineNextOccurrence = [&] (Module& module) -> bool
        {
            for (auto& f : module.functions.get())
            {
                if (! f->functionType.isRun())
                {
                    auto s = findFirstStreamAccess (f);
                    auto a = findFirstAdvanceCall (f);

                    if (s != nullptr || a != nullptr)
                    {
                        if (f->functionType.isUserInit() || f->functionType.isEvent())
                        {
                            if (a != nullptr)
                                a->location.throwError (Errors::advanceCannotBeCalledHere());

                            if (f->functionType.isUserInit())
                                s->location.throwError (Errors::streamsCannotBeUsedDuringInit());
                            else
                                s->location.throwError (Errors::streamsCannotBeUsedInEventCallbacks());
                        }

                        if (OptimiserClass::inlineAllCallsToFunction (program, f))
                            return true;

                        if (a != nullptr)
                            a->location.throwError (Errors::advanceCannotBeCalledHere());

                        s->location.throwError (Errors::streamsCanOnlyBeUsedInRun());
                    }
                }
            }

            return false;
        };

        for (auto& m : program.getModules())
        {
            if (m->isProcessor())
            {
                while (inlineNextOccurrence (m))
                {}
            }
        }
    }